

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::addLine(Builder *this,Id fileName,int lineNum,int column)

{
  Block *this_00;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40 [3];
  Instruction *local_28;
  Instruction *line;
  uint local_18;
  int column_local;
  int lineNum_local;
  Id fileName_local;
  Builder *this_local;
  
  line._4_4_ = column;
  local_18 = lineNum;
  column_local = fileName;
  _lineNum_local = this;
  this_01 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,fileName));
  Instruction::Instruction(this_01,OpLine);
  local_28 = this_01;
  Instruction::addIdOperand(this_01,column_local);
  Instruction::addImmediateOperand(local_28,local_18);
  Instruction::addImmediateOperand(local_28,line._4_4_);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_40,local_28
            );
  Block::addInstruction(this_00,local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_40);
  return;
}

Assistant:

void Builder::addLine(Id fileName, int lineNum, int column)
{
    Instruction* line = new Instruction(OpLine);
    line->addIdOperand(fileName);
    line->addImmediateOperand(lineNum);
    line->addImmediateOperand(column);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(line));
}